

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void sftp_packet_flush(LIBSSH2_SFTP *sftp)

{
  LIBSSH2_SESSION *pLVar1;
  sftp_zombie_requests *psVar2;
  LIBSSH2_SFTP_PACKET *pLVar3;
  sftp_zombie_requests *next_1;
  LIBSSH2_SFTP_PACKET *next;
  sftp_zombie_requests *zombie;
  LIBSSH2_SFTP_PACKET *packet;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp_local;
  
  pLVar1 = sftp->channel->session;
  zombie = (sftp_zombie_requests *)_libssh2_list_first(&sftp->packets);
  next = (LIBSSH2_SFTP_PACKET *)_libssh2_list_first(&sftp->zombie_requests);
  while (zombie != (sftp_zombie_requests *)0x0) {
    psVar2 = (sftp_zombie_requests *)_libssh2_list_next(&zombie->node);
    _libssh2_list_remove(&zombie->node);
    (*pLVar1->free)(zombie[1].node.next,&pLVar1->abstract);
    (*pLVar1->free)(zombie,&pLVar1->abstract);
    zombie = psVar2;
  }
  while (next != (LIBSSH2_SFTP_PACKET *)0x0) {
    pLVar3 = (LIBSSH2_SFTP_PACKET *)_libssh2_list_next(&next->node);
    _libssh2_list_remove(&next->node);
    (*pLVar1->free)(next,&pLVar1->abstract);
    next = pLVar3;
  }
  return;
}

Assistant:

static void sftp_packet_flush(LIBSSH2_SFTP *sftp)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    LIBSSH2_SFTP_PACKET *packet = _libssh2_list_first(&sftp->packets);
    struct sftp_zombie_requests *zombie =
        _libssh2_list_first(&sftp->zombie_requests);

    while(packet) {
        LIBSSH2_SFTP_PACKET *next;

        /* check next struct in the list */
        next =  _libssh2_list_next(&packet->node);
        _libssh2_list_remove(&packet->node);
        LIBSSH2_FREE(session, packet->data);
        LIBSSH2_FREE(session, packet);

        packet = next;
    }

    while(zombie) {
        /* figure out the next node */
        struct sftp_zombie_requests *next = _libssh2_list_next(&zombie->node);
        /* unlink the current one */
        _libssh2_list_remove(&zombie->node);
        /* free the memory */
        LIBSSH2_FREE(session, zombie);
        zombie = next;
    }

}